

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::end_scope_decl(CompilerGLSL *this)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->indent != 0) {
    this->indent = this->indent - 1;
    statement<char_const(&)[3]>(this,(char (*) [3])0x351732);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Popping empty indent stack.","");
  ::std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_003d4e98;
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::end_scope_decl()
{
	if (!indent)
		SPIRV_CROSS_THROW("Popping empty indent stack.");
	indent--;
	statement("};");
}